

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

bool __thiscall
cmCacheManager::ReadPropertyEntry(cmCacheManager *this,string *entryKey,CacheEntry *e)

{
  ulong uVar1;
  pointer pcVar2;
  char *__s;
  CacheEntry *value;
  cmCacheManager *this_00;
  int iVar3;
  size_t sVar4;
  iterator iVar5;
  mapped_type *this_01;
  long lVar6;
  bool bVar7;
  string key;
  allocator<char> local_89;
  string local_88;
  CacheEntry *local_68;
  string *local_60;
  cmCacheManager *local_58;
  key_type local_50;
  
  if (e->Type == INTERNAL) {
    uVar1 = entryKey->_M_string_length;
    pcVar2 = (entryKey->_M_dataplus)._M_p;
    lVar6 = 0;
    local_68 = e;
    local_60 = entryKey;
    local_58 = this;
    do {
      __s = *(char **)((long)PersistentProperties + lVar6);
      sVar4 = strlen(__s);
      if (((sVar4 + 1 < uVar1) && (pcVar2[~sVar4 + uVar1] == '-')) &&
         (iVar3 = strcmp(pcVar2 + ~sVar4 + uVar1 + 1,__s), iVar3 == 0)) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)local_60);
        this_00 = local_58;
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                        *)local_58,&local_50);
        value = local_68;
        if ((_Rb_tree_header *)iVar5._M_node == &(this_00->Cache)._M_t._M_impl.super__Rb_tree_header
           ) {
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                    ::operator[](&this_00->Cache,&local_50);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
          CacheEntry::SetProperty(this_01,&local_88,&value->Value);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
          CacheEntry::SetProperty((CacheEntry *)(iVar5._M_node + 2),&local_88,&value->Value);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        return true;
      }
      lVar6 = lVar6 + 8;
      bVar7 = lVar6 != 0x18;
    } while (bVar7);
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool cmCacheManager::ReadPropertyEntry(const std::string& entryKey,
                                       const CacheEntry& e)
{
  // All property entries are internal.
  if (e.Type != cmStateEnums::INTERNAL) {
    return false;
  }

  const char* end = entryKey.c_str() + entryKey.size();
  for (const char* p : cmCacheManager::PersistentProperties) {
    std::string::size_type plen = strlen(p) + 1;
    if (entryKey.size() > plen && *(end - plen) == '-' &&
        strcmp(end - plen + 1, p) == 0) {
      std::string key = entryKey.substr(0, entryKey.size() - plen);
      if (auto* entry = this->GetCacheEntry(key)) {
        // Store this property on its entry.
        entry->SetProperty(p, e.Value);
      } else {
        // Create an entry and store the property.
        CacheEntry& ne = this->Cache[key];
        ne.SetProperty(p, e.Value);
      }
      return true;
    }
  }
  return false;
}